

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

locate_result * __thiscall
boost::runtime::cla::parser::locate_parameter
          (parser *this,trie_ptr *curr_trie,cstring *name,cstring *token)

{
  static_any_base *psVar1;
  bool bVar2;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *this_00;
  type ppVar3;
  size_type sVar4;
  type ppVar5;
  basic_cstring<const_char> *in_RCX;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *in_RDX;
  locate_result *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_boost::runtime::parameter_cla_id_*>,_bool> pVar6;
  parameter_cla_id *param_id;
  bool _fe_con_494;
  static_any_t _fe_end_494;
  static_any_t _fe_cur_494;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  amb_names;
  parameter_cla_id *param_cand;
  bool _fe_con_473;
  static_any_t _fe_end_473;
  static_any_t _fe_cur_473;
  trie_ptr trie_cand;
  bool _fe_con_468;
  static_any_t _fe_end_468;
  static_any_t _fe_cur_468;
  set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
  unique_typo_candidate;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  typo_candidate_names;
  trie_ptr next_typo_cand;
  trie_ptr typo_cand_1;
  bool _fe_con_450;
  static_any_t _fe_end_450;
  static_any_t _fe_cur_450;
  value_type *typo_cand;
  bool _fe_con_433;
  static_any_t _fe_end_433;
  static_any_t _fe_cur_433;
  char c;
  bool _fe_con_423;
  static_any_t _fe_end_423;
  static_any_t _fe_cur_423;
  trie_ptr next_trie;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  next_typo_candidates;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  typo_candidates;
  value_type *in_stack_fffffffffffff888;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *in_stack_fffffffffffff890;
  parameter_cla_id *ppVar7;
  parameter_cla_id *in_stack_fffffffffffff898;
  pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
  *in_stack_fffffffffffff8a0;
  parameter_cla_id *in_stack_fffffffffffff8a8;
  set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
  *in_stack_fffffffffffff8b0;
  parameter_trie *in_stack_fffffffffffff8b8;
  param_cla_id_list *ppVar8;
  size_type in_stack_fffffffffffff8c8;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  *in_stack_fffffffffffff8d0;
  static_any_base *psVar9;
  undefined7 in_stack_fffffffffffff8e0;
  byte in_stack_fffffffffffff8e7;
  __normal_iterator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_*,_std::vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>_>
  in_stack_fffffffffffff8e8;
  byte local_679;
  byte local_621;
  byte local_5d1;
  byte local_569;
  byte local_519;
  __normal_iterator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_*,_std::vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>_>
  local_3c0;
  static_any_base *local_3b8;
  __normal_iterator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_*,_std::vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>_>
  local_3a8;
  parameter_cla_id *local_3a0;
  _Base_ptr local_278;
  byte local_270;
  parameter_cla_id *local_268;
  _Base_ptr local_260;
  byte local_258;
  parameter_cla_id *local_248;
  byte local_23c;
  __normal_iterator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_*,_std::vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>_>
  local_238;
  static_any_base *local_230;
  __normal_iterator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_*,_std::vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>_>
  local_220;
  static_any_base *local_218;
  undefined1 local_208 [20];
  byte local_1f4;
  __normal_iterator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_*,_std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  local_1f0;
  static_any_base *local_1e8;
  __normal_iterator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_*,_std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  local_1d8;
  static_any_base *local_1d0;
  shared_ptr local_178 [24];
  undefined1 local_160 [20];
  byte local_14c;
  __normal_iterator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_*,_std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  local_148;
  static_any_base *local_140;
  __normal_iterator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_*,_std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  local_130;
  static_any_base *local_128;
  pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>
  *local_100;
  byte local_f4;
  _Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_f0;
  static_any_base *local_e8;
  _Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_d8;
  static_any_base *local_d0;
  char local_b0;
  byte local_ac;
  char *local_a8;
  static_any_base *local_a0;
  char *local_80;
  static_any_base *local_78;
  shared_ptr local_70 [40];
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_48 [2];
  reference local_8;
  
  std::
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ::vector((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            *)0x276857);
  std::
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ::vector((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            *)0x276864);
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
            ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x276871);
  unit_test::for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RCX);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x27688d);
  local_80 = (char *)unit_test::for_each::begin<boost::unit_test::basic_cstring<char_const>>(in_RCX)
  ;
  local_78 = (static_any_base *)&local_80;
  bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_78);
  if (!bVar2) {
    unit_test::for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RCX);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x276913);
    local_a8 = (char *)unit_test::for_each::end<boost::unit_test::basic_cstring<char_const>>(in_RCX)
    ;
    local_a0 = (static_any_base *)&local_a8;
    bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_a0);
    if (!bVar2) {
      local_ac = 1;
      while( true ) {
        psVar1 = local_78;
        psVar9 = local_a0;
        local_519 = 0;
        if ((local_ac & 1) != 0) {
          unit_test::for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RCX);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x2769bb);
          bVar2 = unit_test::for_each::done<boost::unit_test::basic_cstring<char_const>>
                            (psVar1,psVar9,in_RCX);
          local_519 = bVar2 ^ 0xff;
        }
        psVar9 = local_78;
        if ((local_519 & 1) == 0) break;
        local_ac = 0;
        unit_test::for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RCX);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x276a44);
        local_b0 = unit_test::for_each::deref<char,boost::unit_test::basic_cstring<char_const>>
                             (psVar9,in_RCX);
        while (psVar9 = local_78, ((local_ac ^ 0xff) & 1) != 0) {
          bVar2 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)in_RDX);
          if (bVar2) {
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                      (in_stack_fffffffffffff890);
            rt_cla_detail::parameter_trie::get_subtrie
                      (in_stack_fffffffffffff8b8,(char)((ulong)in_stack_fffffffffffff8b0 >> 0x38));
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                      ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                       in_stack_fffffffffffff8a0,
                       (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                       in_stack_fffffffffffff898);
            shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                      ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x276ae3);
            bVar2 = boost::shared_ptr::operator_cast_to_bool(local_70);
            if (bVar2) {
              shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                        ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                         in_stack_fffffffffffff8a0,
                         (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                         in_stack_fffffffffffff898);
            }
            else {
              ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                 (in_stack_fffffffffffff890);
              ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                 (in_stack_fffffffffffff890);
              unit_test::for_each::
              is_const_coll<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                        (&ppVar5->m_subtrie);
              integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x276b49)
              ;
              local_d8._M_node =
                   (_Base_ptr)
                   unit_test::for_each::
                   begin<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                             (ppVar3);
              local_d0 = (static_any_base *)&local_d8;
              bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_d0);
              if (!bVar2) {
                ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                   (in_stack_fffffffffffff890);
                ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                   (in_stack_fffffffffffff890);
                unit_test::for_each::
                is_const_coll<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                          (&ppVar5->m_subtrie);
                integral_constant::operator_cast_to_bool__
                          ((integral_constant<bool,_false> *)0x276bd3);
                local_f0._M_node =
                     (_Base_ptr)
                     unit_test::for_each::
                     end<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                               (ppVar3);
                local_e8 = (static_any_base *)&local_f0;
                bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_e8);
                if (!bVar2) {
                  local_f4 = 1;
                  while( true ) {
                    psVar1 = local_d0;
                    psVar9 = local_e8;
                    local_569 = 0;
                    if ((local_f4 & 1) != 0) {
                      ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      unit_test::for_each::
                      is_const_coll<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                                (&ppVar5->m_subtrie);
                      integral_constant::operator_cast_to_bool__
                                ((integral_constant<bool,_false> *)0x276c9c);
                      bVar2 = unit_test::for_each::
                              done<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                                        (psVar1,psVar9,ppVar3);
                      local_569 = bVar2 ^ 0xff;
                    }
                    psVar9 = local_d0;
                    if ((local_569 & 1) == 0) break;
                    local_f4 = 0;
                    ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                             operator->(in_stack_fffffffffffff890);
                    ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                             operator->(in_stack_fffffffffffff890);
                    unit_test::for_each::
                    is_const_coll<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                              (&ppVar5->m_subtrie);
                    integral_constant::operator_cast_to_bool__
                              ((integral_constant<bool,_false> *)0x276d42);
                    local_100 = unit_test::for_each::
                                deref<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>const&,std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                                          (psVar9,ppVar3);
                    while (psVar9 = local_d0, ((local_f4 ^ 0xff) & 1) != 0) {
                      std::
                      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ::push_back((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                                   *)in_stack_fffffffffffff8a0,
                                  (value_type *)in_stack_fffffffffffff898);
                      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                (in_stack_fffffffffffff890);
                      rt_cla_detail::parameter_trie::get_subtrie
                                (in_stack_fffffffffffff8b8,
                                 (char)((ulong)in_stack_fffffffffffff8b0 >> 0x38));
                      this_00 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                                operator=((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
                                           *)in_stack_fffffffffffff8a0,
                                          (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>
                                           *)in_stack_fffffffffffff898);
                      bVar2 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)this_00);
                      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                                ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                                 0x276dfc);
                      if (bVar2) {
                        std::
                        vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                        ::push_back((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                                     *)in_stack_fffffffffffff8a0,
                                    (value_type *)in_stack_fffffffffffff898);
                      }
                      local_f4 = 1;
                    }
                    if ((local_f4 & 1) == 0) {
                      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                (in_stack_fffffffffffff890);
                    }
                    else {
                      ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      unit_test::for_each::
                      is_const_coll<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                                (&ppVar5->m_subtrie);
                      integral_constant::operator_cast_to_bool__
                                ((integral_constant<bool,_false> *)0x276e88);
                      unit_test::for_each::
                      next<std::map<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>>
                                (psVar9,ppVar3);
                    }
                  }
                }
              }
              std::
              vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ::push_back((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                           *)in_stack_fffffffffffff8a0,(value_type *)in_stack_fffffffffffff898);
              shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::reset
                        ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                         in_stack_fffffffffffff8a0);
            }
          }
          else {
            unit_test::for_each::
            is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                      (local_48);
            integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x276efe);
            local_130._M_current =
                 (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                 unit_test::for_each::
                 begin<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                           (local_48);
            local_128 = (static_any_base *)&local_130;
            bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_128);
            if (!bVar2) {
              unit_test::for_each::
              is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                        (local_48);
              integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x276f6b)
              ;
              local_148._M_current =
                   (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                   unit_test::for_each::
                   end<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                             (local_48);
              local_140 = (static_any_base *)&local_148;
              bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_140);
              if (!bVar2) {
                local_14c = 1;
                while( true ) {
                  psVar1 = local_128;
                  psVar9 = local_140;
                  local_5d1 = 0;
                  if ((local_14c & 1) != 0) {
                    unit_test::for_each::
                    is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                              (local_48);
                    integral_constant::operator_cast_to_bool__
                              ((integral_constant<bool,_false> *)0x277013);
                    bVar2 = unit_test::for_each::
                            done<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                                      (psVar1,psVar9,local_48);
                    local_5d1 = bVar2 ^ 0xff;
                  }
                  psVar9 = local_128;
                  if ((local_5d1 & 1) == 0) break;
                  local_14c = 0;
                  unit_test::for_each::
                  is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                            (local_48);
                  integral_constant::operator_cast_to_bool__
                            ((integral_constant<bool,_false> *)0x27709c);
                  unit_test::for_each::
                  deref<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                            (local_160,psVar9,local_48);
                  while (((local_14c ^ 0xff) & 1) != 0) {
                    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                              (in_stack_fffffffffffff890);
                    rt_cla_detail::parameter_trie::get_subtrie
                              (in_stack_fffffffffffff8b8,
                               (char)((ulong)in_stack_fffffffffffff8b0 >> 0x38));
                    bVar2 = boost::shared_ptr::operator_cast_to_bool(local_178);
                    if (bVar2) {
                      std::
                      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ::push_back((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                                   *)in_stack_fffffffffffff8a0,
                                  (value_type *)in_stack_fffffffffffff898);
                    }
                    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                               0x277177);
                    local_14c = 1;
                  }
                  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                            ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                             0x2770d9);
                  psVar9 = local_128;
                  if ((local_14c & 1) != 0) {
                    unit_test::for_each::
                    is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                              (local_48);
                    integral_constant::operator_cast_to_bool__
                              ((integral_constant<bool,_false> *)0x2771d0);
                    unit_test::for_each::
                    next<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                              (psVar9,local_48);
                  }
                }
              }
            }
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::swap((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    *)in_stack_fffffffffffff8a0,
                   (vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    *)in_stack_fffffffffffff898);
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::clear((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                     *)0x277218);
          }
          local_ac = 1;
        }
        if ((local_ac & 1) != 0) {
          unit_test::for_each::is_const_coll<boost::unit_test::basic_cstring<char_const>>(in_RCX);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277261);
          unit_test::for_each::next<boost::unit_test::basic_cstring<char_const>>(psVar9,in_RCX);
        }
      }
    }
  }
  bVar2 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator!(in_RDX);
  if (bVar2) {
    std::
    vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
    ::vector((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
              *)0x2772b2);
    std::
    set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
    ::set((set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
           *)0x2772bf);
    std::
    vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
    ::size(local_48);
    std::
    vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
    ::reserve(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    unit_test::for_each::
    is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
              (local_48);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x2772fa);
    local_1d8._M_current =
         (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
         unit_test::for_each::
         begin<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                   (local_48);
    local_1d0 = (static_any_base *)&local_1d8;
    bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_1d0);
    if (!bVar2) {
      unit_test::for_each::
      is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                (local_48);
      integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277380);
      local_1f0._M_current =
           (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
           unit_test::for_each::
           end<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                     (local_48);
      local_1e8 = (static_any_base *)&local_1f0;
      bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_1e8);
      if (!bVar2) {
        local_1f4 = 1;
        while( true ) {
          psVar1 = local_1d0;
          psVar9 = local_1e8;
          local_621 = 0;
          if ((local_1f4 & 1) != 0) {
            unit_test::for_each::
            is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                      (local_48);
            integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277428);
            bVar2 = unit_test::for_each::
                    done<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                              (psVar1,psVar9,local_48);
            local_621 = bVar2 ^ 0xff;
          }
          psVar9 = local_1d0;
          if ((local_621 & 1) == 0) break;
          local_1f4 = 0;
          unit_test::for_each::
          is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                    (local_48);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x2774b1);
          unit_test::for_each::
          deref<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                    (local_208,psVar9,local_48);
          while (((local_1f4 ^ 0xff) & 1) != 0) {
            ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                               (in_stack_fffffffffffff890);
            sVar4 = std::
                    vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                    ::size(&ppVar3->m_id_candidates);
            if (sVar4 < 2) {
              ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                 (in_stack_fffffffffffff890);
              ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                 (in_stack_fffffffffffff890);
              unit_test::for_each::
              is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                        (&ppVar5->m_id_candidates);
              integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277560)
              ;
              local_220._M_current =
                   (reference_wrapper<const_boost::runtime::parameter_cla_id> *)
                   unit_test::for_each::
                   begin<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                             (&ppVar3->m_id_candidates);
              local_218 = (static_any_base *)&local_220;
              bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_218);
              if (!bVar2) {
                ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                   (in_stack_fffffffffffff890);
                ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                   (in_stack_fffffffffffff890);
                unit_test::for_each::
                is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                          (&ppVar5->m_id_candidates);
                integral_constant::operator_cast_to_bool__
                          ((integral_constant<bool,_false> *)0x277620);
                local_238._M_current =
                     (reference_wrapper<const_boost::runtime::parameter_cla_id> *)
                     unit_test::for_each::
                     end<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                               (&ppVar3->m_id_candidates);
                local_230 = (static_any_base *)&local_238;
                bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_230);
                if (!bVar2) {
                  local_23c = 1;
                  while( true ) {
                    psVar1 = local_218;
                    psVar9 = local_230;
                    local_679 = 0;
                    if ((local_23c & 1) != 0) {
                      ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      unit_test::for_each::
                      is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                                (&ppVar5->m_id_candidates);
                      integral_constant::operator_cast_to_bool__
                                ((integral_constant<bool,_false> *)0x2776f9);
                      bVar2 = unit_test::for_each::
                              done<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                                        (psVar1,psVar9,&ppVar3->m_id_candidates);
                      local_679 = bVar2 ^ 0xff;
                    }
                    psVar9 = local_218;
                    if ((local_679 & 1) == 0) break;
                    local_23c = 0;
                    ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                             operator->(in_stack_fffffffffffff890);
                    ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                             operator->(in_stack_fffffffffffff890);
                    unit_test::for_each::
                    is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                              (&ppVar5->m_id_candidates);
                    integral_constant::operator_cast_to_bool__
                              ((integral_constant<bool,_false> *)0x2777af);
                    local_248 = unit_test::for_each::
                                deref<boost::runtime::parameter_cla_id_const&,std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                                          (psVar9,&ppVar3->m_id_candidates);
                    while (psVar9 = local_218, ((local_23c ^ 0xff) & 1) != 0) {
                      local_268 = local_248;
                      pVar6 = std::
                              set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
                              ::insert(in_stack_fffffffffffff8b0,
                                       (value_type *)in_stack_fffffffffffff8a8);
                      local_278 = (_Base_ptr)pVar6.first._M_node;
                      local_270 = pVar6.second;
                      local_260 = local_278;
                      local_258 = local_270;
                      if (((local_270 ^ 0xff) & 1) == 0) {
                        unit_test::basic_cstring<const_char>::basic_cstring
                                  ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0,
                                   &in_stack_fffffffffffff898->m_prefix);
                        std::
                        vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                        ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                                     *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                      }
                      local_23c = 1;
                    }
                    if ((local_23c & 1) == 0) {
                      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                                (in_stack_fffffffffffff890);
                    }
                    else {
                      ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
                               operator->(in_stack_fffffffffffff890);
                      unit_test::for_each::
                      is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                                (&ppVar5->m_id_candidates);
                      integral_constant::operator_cast_to_bool__
                                ((integral_constant<bool,_false> *)0x27791d);
                      unit_test::for_each::
                      next<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                                (psVar9,&ppVar3->m_id_candidates);
                    }
                  }
                }
              }
            }
            local_1f4 = 1;
          }
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                    ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x2774ee);
          psVar9 = local_1d0;
          if ((local_1f4 & 1) != 0) {
            unit_test::for_each::
            is_const_coll<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                      (local_48);
            integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277997);
            unit_test::for_each::
            next<std::vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
                      (psVar9,local_48);
          }
        }
      }
    }
    unrecognized_param::unrecognized_param
              ((unrecognized_param *)in_stack_fffffffffffff8a0,
               (vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                *)in_stack_fffffffffffff898);
    specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::
    operator<<((specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                *)in_stack_fffffffffffff8a8,(char *)in_stack_fffffffffffff8a0);
    specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>::operator<<
              ((specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                *)in_stack_fffffffffffff8e8._M_current,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    unit_test::ut_detail::throw_exception<boost::runtime::unrecognized_param>
              ((unrecognized_param *)in_stack_fffffffffffff8a0);
  }
  ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                     (in_stack_fffffffffffff890);
  sVar4 = std::
          vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
          ::size(&ppVar3->m_id_candidates);
  if (sVar4 < 2) {
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
              (in_stack_fffffffffffff890);
    local_8 = std::
              vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
              ::back((vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                      *)in_stack_fffffffffffff890);
    ppVar7 = local_8->t_;
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)ppVar7);
    std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
    pair<boost::shared_ptr<boost::runtime::basic_param>_&,_true>
              (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
               (shared_ptr<boost::runtime::basic_param> *)ppVar7);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x277f36);
    std::
    vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
    ::~vector((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               *)in_stack_fffffffffffff8a0);
    std::
    vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
    ::~vector((vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               *)in_stack_fffffffffffff8a0);
    return in_RDI;
  }
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
            *)0x277ad6);
  ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                     (in_stack_fffffffffffff890);
  ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                     (in_stack_fffffffffffff890);
  unit_test::for_each::
  is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
            (&ppVar5->m_id_candidates);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277b14);
  local_3a8._M_current =
       (reference_wrapper<const_boost::runtime::parameter_cla_id> *)
       unit_test::for_each::
       begin<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                 (&ppVar3->m_id_candidates);
  local_3a0 = (parameter_cla_id *)&local_3a8;
  bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool((static_any_base *)local_3a0);
  if (!bVar2) {
    ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                       (in_stack_fffffffffffff890);
    ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                       (in_stack_fffffffffffff890);
    unit_test::for_each::
    is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
              (&ppVar5->m_id_candidates);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277bb3);
    in_stack_fffffffffffff8e8._M_current =
         (reference_wrapper<const_boost::runtime::parameter_cla_id> *)
         unit_test::for_each::
         end<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                   (&ppVar3->m_id_candidates);
    local_3b8 = (static_any_base *)&local_3c0;
    local_3c0._M_current = in_stack_fffffffffffff8e8._M_current;
    bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_3b8);
    if (!bVar2) {
      while( true ) {
        ppVar7 = local_3a0;
        psVar9 = local_3b8;
        ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        ppVar5 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        unit_test::for_each::
        is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                  (&ppVar5->m_id_candidates);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277c6b);
        bVar2 = unit_test::for_each::
                done<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                          (ppVar7,psVar9,&ppVar3->m_id_candidates);
        in_stack_fffffffffffff8e7 = bVar2 ^ 0xff;
        if ((in_stack_fffffffffffff8e7 & 1) == 0) break;
        ppVar7 = local_3a0;
        ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        ppVar8 = &ppVar3->m_id_candidates;
        ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        unit_test::for_each::
        is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                  (&ppVar3->m_id_candidates);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277cfe);
        in_stack_fffffffffffff8a8 =
             unit_test::for_each::
             deref<boost::runtime::parameter_cla_id_const&,std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                       (ppVar7,ppVar8);
        bVar2 = false;
        while (!bVar2) {
          unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0,
                     &in_stack_fffffffffffff898->m_prefix);
          std::
          vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
          ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                       *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
          bVar2 = true;
        }
        in_stack_fffffffffffff898 = local_3a0;
        ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        in_stack_fffffffffffff8a0 =
             (pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
              *)&ppVar3->m_id_candidates;
        ppVar3 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->
                           (in_stack_fffffffffffff890);
        unit_test::for_each::
        is_const_coll<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                  (&ppVar3->m_id_candidates);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_false> *)0x277dc9);
        unit_test::for_each::
        next<std::vector<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>,std::allocator<boost::reference_wrapper<boost::runtime::parameter_cla_id_const>>>>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff8a0);
      }
    }
  }
  ambiguous_param::ambiguous_param
            ((ambiguous_param *)in_stack_fffffffffffff8a0,
             (vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
              *)in_stack_fffffffffffff898);
  specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>::operator<<
            ((specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error> *)
             in_stack_fffffffffffff8a8,(char *)in_stack_fffffffffffff8a0);
  specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::operator<<
            ((specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error> *)
             in_stack_fffffffffffff8e8._M_current,
             (basic_cstring<const_char> *)
             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
  unit_test::ut_detail::throw_exception<boost::runtime::ambiguous_param>
            ((ambiguous_param *)in_stack_fffffffffffff8a0);
}

Assistant:

locate_result
    locate_parameter( trie_ptr curr_trie, cstring name, cstring token )
    {
        std::vector<trie_ptr> typo_candidates;
        std::vector<trie_ptr> next_typo_candidates;
        trie_ptr next_trie;

        BOOST_TEST_FOREACH( char, c, name ) {
            if( curr_trie ) {
                // locate next subtrie corresponding to the char
                next_trie = curr_trie->get_subtrie( c );

                if( next_trie )
                    curr_trie = next_trie;
                else {
                    // Initiate search for typo candicates. We will account for 'wrong char' typo
                    // 'missing char' typo and 'extra char' typo
                    BOOST_TEST_FOREACH( trie_per_char::value_type const&, typo_cand, curr_trie->m_subtrie ) {
                        // 'wrong char' typo
                        typo_candidates.push_back( typo_cand.second );

                        // 'missing char' typo
                        if( (next_trie = typo_cand.second->get_subtrie( c )) )
                            typo_candidates.push_back( next_trie );
                    }

                    // 'extra char' typo
                    typo_candidates.push_back( curr_trie );

                    curr_trie.reset();
                }
            }
            else {
                // go over existing typo candidates and see if they are still viable
                BOOST_TEST_FOREACH( trie_ptr, typo_cand, typo_candidates ) {
                    trie_ptr next_typo_cand = typo_cand->get_subtrie( c );

                    if( next_typo_cand )
                        next_typo_candidates.push_back( next_typo_cand );
                }

                next_typo_candidates.swap( typo_candidates );
                next_typo_candidates.clear();
            }
        }

        if( !curr_trie ) {
            std::vector<cstring> typo_candidate_names;
            std::set<parameter_cla_id const*> unique_typo_candidate; // !! ?? unordered_set
            typo_candidate_names.reserve( typo_candidates.size() );
// !! ??            unique_typo_candidate.reserve( typo_candidates.size() );

            BOOST_TEST_FOREACH( trie_ptr, trie_cand, typo_candidates ) {
                // avoid ambiguos candidate trie
                if( trie_cand->m_id_candidates.size() > 1 )
                    continue;

                BOOST_TEST_FOREACH( parameter_cla_id const&, param_cand, trie_cand->m_id_candidates ) {
                    if( !unique_typo_candidate.insert( &param_cand ).second )
                        continue;

                    typo_candidate_names.push_back( param_cand.m_tag );
                }
            }

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( unrecognized_param( std::move(typo_candidate_names) )
                                << "An unrecognized parameter in the argument "
                                << token );
#else
            BOOST_TEST_I_THROW( unrecognized_param( typo_candidate_names )
                                << "An unrecognized parameter in the argument "
                                << token );
#endif
        }

        if( curr_trie->m_id_candidates.size() > 1 ) {
            std::vector<cstring> amb_names;
            BOOST_TEST_FOREACH( parameter_cla_id const&, param_id, curr_trie->m_id_candidates )
                amb_names.push_back( param_id.m_tag );

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( ambiguous_param( std::move( amb_names ) )
                                << "An ambiguous parameter name in the argument " << token );
#else
            BOOST_TEST_I_THROW( ambiguous_param( amb_names )
                                << "An ambiguous parameter name in the argument " << token );
#endif
        }

        return locate_result( curr_trie->m_id_candidates.back().get(), curr_trie->m_param_candidate );
    }